

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackGenerator::InstallProjectViaInstalledDirectories
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory,
          mode_t *default_dir_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  pointer ppVar5;
  undefined8 msg;
  pointer pRVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  size_t sVar10;
  ostream *poVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long *plVar12;
  undefined8 *puVar13;
  ulong *puVar14;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 extraout_DL_05;
  undefined1 extraout_DL_06;
  undefined1 extraout_DL_07;
  undefined1 extraout_DL_08;
  undefined1 collapse;
  pointer pbVar15;
  int iVar16;
  string *psVar17;
  pointer ppVar18;
  undefined8 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  pointer this_00;
  ulong *puVar20;
  string inFileRelative;
  string destDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreFilesRegexString;
  string filePath;
  string top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirectoriesVector;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symlinkedFiles;
  string subdir;
  Glob gl;
  ostringstream cmCPackLog_msg;
  string findExpr;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> ignoreFilesRegex;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [32];
  int local_338;
  string local_328;
  string local_308;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  pointer local_288;
  string *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [81];
  bool bStack_207;
  undefined1 local_200 [112];
  ios_base local_190 [264];
  string local_88;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  mode_t *local_40;
  string *local_38;
  
  local_68.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_start = (RegularExpression *)0x0;
  local_68.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (RegularExpression *)0x0;
  local_68.super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = local_200 + 0x10;
  local_280 = tempInstallDirectory;
  local_200._0_8_ = pcVar3;
  local_40 = default_dir_mode;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"CPACK_IGNORE_FILES","");
  pcVar9 = GetOption(this,(string *)local_200);
  if ((pointer)local_200._0_8_ != pcVar3) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  if (pcVar9 != (char *)0x0) {
    local_358._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_358._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_358._16_8_ = (pointer)0x0;
    local_200._0_8_ = pcVar3;
    sVar10 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar9,pcVar9 + sVar10);
    cmSystemTools::ExpandListArgument
              ((string *)local_200,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_358,false);
    if ((pointer)local_200._0_8_ != pcVar3) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    uVar19 = local_358._8_8_;
    if (local_358._0_8_ != local_358._8_8_) {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_200,"Create ignore files regex for: ",0x1f);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,(__args->_M_dataplus)._M_p,
                             __args->_M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        msg = local_258._0_8_;
        sVar10 = strlen((char *)local_258._0_8_);
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x13e,(char *)msg,sVar10);
        if ((GlobInternals *)local_258._0_8_ != (GlobInternals *)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
        std::ios_base::~ios_base(local_190);
        std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                   &local_68,__args);
        __args = __args + 1;
      } while (__args != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar19
              );
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_358);
  }
  puVar20 = (ulong *)(local_200 + 0x10);
  local_200._0_8_ = puVar20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_200,"CPACK_INSTALLED_DIRECTORIES","");
  pcVar9 = GetOption(this,(string *)local_200);
  if ((ulong *)local_200._0_8_ != puVar20) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  iVar16 = 1;
  if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_200._0_8_ = puVar20;
    sVar10 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,pcVar9,pcVar9 + sVar10);
    cmSystemTools::ExpandListArgument((string *)local_200,&local_2c8,false);
    if ((ulong *)local_200._0_8_ != puVar20) {
      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
    }
    if (((int)local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
         (int)local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
      if (local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_48 = &this->files;
        pbVar15 = local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_2a8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_288 = pbVar15;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"Find files",10);
          std::ios::widen((char)*(ulong *)(local_200._0_8_ + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          uVar19 = local_258._0_8_;
          sVar10 = strlen((char *)local_258._0_8_);
          cmCPackLog::Log(pcVar2,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x156,(char *)uVar19,sVar10);
          if ((GlobInternals *)local_258._0_8_ != (GlobInternals *)(local_258 + 0x10)) {
            operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
          std::ios_base::~ios_base(local_190);
          cmsys::Glob::Glob((Glob *)local_258);
          pbVar15 = local_288;
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          pcVar3 = (local_288->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e8,pcVar3,pcVar3 + local_288->_M_string_length);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          pcVar3 = pbVar15[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,pcVar3,pcVar3 + pbVar15[1]._M_string_length);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,local_2e8._M_dataplus._M_p,
                     local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
          std::__cxx11::string::append((char *)&local_88);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_200,"- Install directory: ",0x15);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,local_2e8._M_dataplus._M_p,
                               local_2e8._M_string_length);
          std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          pcVar2 = this->Logger;
          std::__cxx11::stringbuf::str();
          uVar19 = local_358._0_8_;
          sVar10 = strlen((char *)local_358._0_8_);
          cmCPackLog::Log(pcVar2,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x15e,(char *)uVar19,sVar10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_358 + 0x10)) {
            operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
          std::ios_base::~ios_base(local_190);
          local_258[8] = true;
          bStack_207 = true;
          bVar7 = cmsys::Glob::FindFiles((Glob *)local_258,&local_88,(GlobMessages *)0x0);
          if (bVar7) {
            __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_258);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(local_48,__x);
            psVar17 = (this->files).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_38 = (this->files).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            collapse = extraout_DL;
            if (psVar17 != local_38) {
              do {
                local_358._0_8_ = local_358 + 0x10;
                pcVar3 = (psVar17->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_358,pcVar3,pcVar3 + psVar17->_M_string_length);
                bVar7 = cmsys::SystemTools::FileIsDirectory(psVar17);
                if (bVar7) {
                  std::__cxx11::string::push_back((char)(string *)local_358);
                }
                pRVar6 = local_68.
                         super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (local_68.
                    super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    local_68.
                    super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0014adcf:
                  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                  pcVar3 = (local_280->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_328,pcVar3,pcVar3 + local_280->_M_string_length);
                  std::operator+(&local_378,"/",&local_278);
                  paVar1 = &local_398.field_2;
                  plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
                  puVar14 = (ulong *)(plVar12 + 2);
                  puVar20 = (ulong *)(local_200 + 0x10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar14) {
                    local_398.field_2._M_allocated_capacity = *puVar14;
                    local_398.field_2._8_8_ = plVar12[3];
                    local_398._M_dataplus._M_p = (pointer)paVar1;
                  }
                  else {
                    local_398.field_2._M_allocated_capacity = *puVar14;
                    local_398._M_dataplus._M_p = (pointer)*plVar12;
                  }
                  local_398._M_string_length = plVar12[1];
                  *plVar12 = (long)puVar14;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  cmSystemTools::RelativePath(&local_308,&local_2e8,psVar17);
                  uVar19 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != paVar1) {
                    uVar19 = local_398.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar19 < local_308._M_string_length + local_398._M_string_length) {
                    uVar19 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_308._M_dataplus._M_p != &local_308.field_2) {
                      uVar19 = local_308.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar19 < local_308._M_string_length + local_398._M_string_length)
                    goto LAB_0014aee5;
                    puVar13 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_308,0,(char *)0x0,
                                         (ulong)local_398._M_dataplus._M_p);
                  }
                  else {
LAB_0014aee5:
                    puVar13 = (undefined8 *)
                              std::__cxx11::string::_M_append
                                        ((char *)&local_398,(ulong)local_308._M_dataplus._M_p);
                  }
                  puVar14 = puVar13 + 2;
                  if ((ulong *)*puVar13 == puVar14) {
                    local_200._16_8_ = *puVar14;
                    local_200._24_8_ = puVar13[3];
                    local_200._0_8_ = puVar20;
                  }
                  else {
                    local_200._16_8_ = *puVar14;
                    local_200._0_8_ = (ulong *)*puVar13;
                  }
                  local_200._8_8_ = puVar13[1];
                  *puVar13 = puVar14;
                  puVar13[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  std::__cxx11::string::_M_append((char *)&local_328,local_200._0_8_);
                  if ((ulong *)local_200._0_8_ != puVar20) {
                    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_308._M_dataplus._M_p != &local_308.field_2) {
                    operator_delete(local_308._M_dataplus._M_p,
                                    local_308.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != paVar1) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_378._M_dataplus._M_p != &local_378.field_2) {
                    operator_delete(local_378._M_dataplus._M_p,
                                    local_378.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,"Copy file: ",0xb);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,(char *)local_358._0_8_,local_358._8_8_)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11," -> ",4);
                  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar11,local_328._M_dataplus._M_p,local_328._M_string_length
                                      );
                  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                  std::ostream::put((char)poVar11);
                  std::ostream::flush();
                  pcVar2 = this->Logger;
                  std::__cxx11::stringbuf::str();
                  _Var4._M_p = local_398._M_dataplus._M_p;
                  sVar10 = strlen(local_398._M_dataplus._M_p);
                  cmCPackLog::Log(pcVar2,4,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                  ,0x17c,_Var4._M_p,sVar10);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._M_dataplus._M_p != paVar1) {
                    operator_delete(local_398._M_dataplus._M_p,
                                    local_398.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                  std::ios_base::~ios_base(local_190);
                  bVar7 = cmsys::SystemTools::FileIsSymlink((string *)local_358);
                  if (bVar7) {
                    local_200._8_8_ = 0;
                    local_200._16_8_ = local_200._16_8_ & 0xffffffffffffff00;
                    local_200._0_8_ = puVar20;
                    cmSystemTools::RelativePath(&local_398,&local_2e8,(string *)local_358);
                    cmsys::SystemTools::ReadSymlink((string *)local_358,(string *)local_200);
                    std::
                    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    ::emplace_back<std::__cxx11::string,std::__cxx11::string>
                              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                                *)&local_2a8,(string *)local_200,&local_398);
                    collapse = extraout_DL_02;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_398._M_dataplus._M_p != paVar1) {
                      operator_delete(local_398._M_dataplus._M_p,
                                      local_398.field_2._M_allocated_capacity + 1);
                      collapse = extraout_DL_03;
                    }
                    if ((ulong *)local_200._0_8_ != puVar20) {
                      operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
                      collapse = extraout_DL_04;
                    }
                    iVar16 = 0;
                  }
                  else {
                    bVar7 = cmsys::SystemTools::CopyFileIfDifferent((string *)local_358,&local_328);
                    if (bVar7) {
                      bVar7 = cmFileTimes::Copy((string *)local_358,&local_328);
                      iVar16 = 0;
                      collapse = extraout_DL_05;
                      if (bVar7) goto LAB_0014b2c5;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,"Problem copying file: ",0x16);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_200,(char *)local_358._0_8_,
                                         local_358._8_8_);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11," -> ",4);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,local_328._M_dataplus._M_p,
                                         local_328._M_string_length);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = this->Logger;
                    std::__cxx11::stringbuf::str();
                    _Var4._M_p = local_398._M_dataplus._M_p;
                    sVar10 = strlen(local_398._M_dataplus._M_p);
                    cmCPackLog::Log(pcVar2,0x10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x18b,_Var4._M_p,sVar10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_398._M_dataplus._M_p != paVar1) {
                      operator_delete(local_398._M_dataplus._M_p,
                                      local_398.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                    std::ios_base::~ios_base(local_190);
                    iVar16 = 1;
                    collapse = extraout_DL_06;
                  }
LAB_0014b2c5:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_328._M_dataplus._M_p != &local_328.field_2) {
                    operator_delete(local_328._M_dataplus._M_p,
                                    local_328.field_2._M_allocated_capacity + 1);
                    collapse = extraout_DL_07;
                  }
                }
                else {
                  bVar7 = false;
                  this_00 = local_68.
                            super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    while (bVar8 = cmsys::RegularExpression::find
                                             (this_00,(char *)local_358._0_8_,&this_00->regmatch),
                          !bVar8) {
                      this_00 = this_00 + 1;
                      if (this_00 == pRVar6) {
                        iVar16 = 0x12;
                        collapse = extraout_DL_00;
                        if (bVar7) goto LAB_0014b2ea;
                        goto LAB_0014adcf;
                      }
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,"Ignore file: ",0xd);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_200,(char *)local_358._0_8_,
                                         local_358._8_8_);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = this->Logger;
                    std::__cxx11::stringbuf::str();
                    _Var4._M_p = local_328._M_dataplus._M_p;
                    sVar10 = strlen(local_328._M_dataplus._M_p);
                    cmCPackLog::Log(pcVar2,2,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x171,_Var4._M_p,sVar10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p != &local_328.field_2) {
                      operator_delete(local_328._M_dataplus._M_p,
                                      local_328.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                    std::ios_base::~ios_base(local_190);
                    this_00 = this_00 + 1;
                    bVar7 = true;
                  } while (this_00 != pRVar6);
                  iVar16 = 0x12;
                  collapse = extraout_DL_01;
                }
LAB_0014b2ea:
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_358._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_358 + 0x10)) {
                  operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
                  collapse = extraout_DL_08;
                }
                if ((iVar16 != 0x12) && (iVar16 != 0)) goto LAB_0014bad0;
                psVar17 = psVar17 + 1;
              } while (psVar17 != local_38);
            }
            if (local_2a8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_2a8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                        (&local_328,(SystemTools *)0x1,(bool)collapse);
              pcVar3 = (local_280->_M_dataplus)._M_p;
              local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_398,pcVar3,pcVar3 + local_280->_M_string_length);
              std::operator+((string *)local_200,"/",&local_278);
              std::__cxx11::string::_M_append((char *)&local_398,local_200._0_8_);
              if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
                operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_200,"Change dir to: ",0xf);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_200,local_398._M_dataplus._M_p,
                                   local_398._M_string_length);
              std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              pcVar2 = this->Logger;
              std::__cxx11::stringbuf::str();
              uVar19 = local_358._0_8_;
              sVar10 = strlen((char *)local_358._0_8_);
              cmCPackLog::Log(pcVar2,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x195,(char *)uVar19,sVar10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_358._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_358 + 0x10)) {
                operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
              std::ios_base::~ios_base(local_190);
              cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_358,&local_398);
              ppVar5 = local_2a8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (local_338 == 0) {
                if (local_2a8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_2a8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  psVar17 = &(local_2a8.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->second;
                  do {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_200,"Will create a symlink: ",0x17);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_200,(psVar17->_M_dataplus)._M_p,
                                         psVar17->_M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"--> ",4);
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,psVar17[-1]._M_dataplus._M_p,
                                         psVar17[-1]._M_string_length);
                    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                    std::ostream::put((char)poVar11);
                    std::ostream::flush();
                    pcVar2 = this->Logger;
                    std::__cxx11::stringbuf::str();
                    _Var4._M_p = local_378._M_dataplus._M_p;
                    sVar10 = strlen(local_378._M_dataplus._M_p);
                    cmCPackLog::Log(pcVar2,4,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x1a3,_Var4._M_p,sVar10);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378._M_dataplus._M_p != &local_378.field_2) {
                      operator_delete(local_378._M_dataplus._M_p,
                                      local_378.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                    std::ios_base::~ios_base(local_190);
                    cmsys::SystemTools::GetFilenamePath(&local_378,psVar17);
                    if ((local_378._M_string_length != 0) &&
                       (bVar7 = cmsys::SystemTools::MakeDirectory(&local_378,local_40), !bVar7)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_200,"Cannot create dir: ",0x13);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,local_378._M_dataplus._M_p,
                                           local_378._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,"\nTrying to create symlink: ",0x1b);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,(psVar17->_M_dataplus)._M_p,
                                           psVar17->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"--> ",4);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,psVar17[-1]._M_dataplus._M_p,
                                           psVar17[-1]._M_string_length);
                      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                      std::ostream::put((char)poVar11);
                      std::ostream::flush();
                      pcVar2 = this->Logger;
                      std::__cxx11::stringbuf::str();
                      _Var4._M_p = local_308._M_dataplus._M_p;
                      sVar10 = strlen(local_308._M_dataplus._M_p);
                      cmCPackLog::Log(pcVar2,0x10,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                      ,0x1ad,_Var4._M_p,sVar10);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_308._M_dataplus._M_p != &local_308.field_2) {
                        operator_delete(local_308._M_dataplus._M_p,
                                        local_308.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                      std::ios_base::~ios_base(local_190);
                    }
                    bVar7 = cmSystemTools::CreateSymlink(psVar17 + -1,psVar17,(string *)0x0);
                    if (!bVar7) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_200,"Cannot create symlink: ",0x17);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,(psVar17->_M_dataplus)._M_p,
                                           psVar17->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"--> ",4);
                      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar11,psVar17[-1]._M_dataplus._M_p,
                                           psVar17[-1]._M_string_length);
                      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                      std::ostream::put((char)poVar11);
                      std::ostream::flush();
                      pcVar2 = this->Logger;
                      std::__cxx11::stringbuf::str();
                      _Var4._M_p = local_308._M_dataplus._M_p;
                      sVar10 = strlen(local_308._M_dataplus._M_p);
                      cmCPackLog::Log(pcVar2,0x10,
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                      ,0x1b4,_Var4._M_p,sVar10);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_308._M_dataplus._M_p != &local_308.field_2) {
                        operator_delete(local_308._M_dataplus._M_p,
                                        local_308.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                      std::ios_base::~ios_base(local_190);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_378._M_dataplus._M_p != &local_378.field_2) {
                        operator_delete(local_378._M_dataplus._M_p,
                                        local_378.field_2._M_allocated_capacity + 1);
                      }
                      bVar7 = false;
                      goto LAB_0014ba82;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378._M_dataplus._M_p != &local_378.field_2) {
                      operator_delete(local_378._M_dataplus._M_p,
                                      local_378.field_2._M_allocated_capacity + 1);
                    }
                    ppVar18 = (pointer)(psVar17 + 1);
                    psVar17 = psVar17 + 2;
                  } while (ppVar18 != ppVar5);
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"Going back to: ",0xf);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,local_328._M_dataplus._M_p,
                                     local_328._M_string_length);
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar2 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var4._M_p = local_378._M_dataplus._M_p;
                sVar10 = strlen(local_378._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,4,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x1b9,_Var4._M_p,sVar10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_dataplus._M_p != &local_378.field_2) {
                  operator_delete(local_378._M_dataplus._M_p,
                                  local_378.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                std::ios_base::~ios_base(local_190);
                bVar7 = true;
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"Failed to change working directory to ",0x26);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_200,local_398._M_dataplus._M_p,
                                     local_398._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," : ",3);
                pcVar9 = strerror(local_338);
                if (pcVar9 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)poVar11->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar10 = strlen(pcVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar9,sVar10);
                }
                std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                pcVar2 = this->Logger;
                std::__cxx11::stringbuf::str();
                _Var4._M_p = local_378._M_dataplus._M_p;
                sVar10 = strlen(local_378._M_dataplus._M_p);
                cmCPackLog::Log(pcVar2,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x19c,_Var4._M_p,sVar10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_dataplus._M_p != &local_378.field_2) {
                  operator_delete(local_378._M_dataplus._M_p,
                                  local_378.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                std::ios_base::~ios_base(local_190);
                bVar7 = false;
              }
LAB_0014ba82:
              cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_358);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                operator_delete(local_328._M_dataplus._M_p,
                                local_328.field_2._M_allocated_capacity + 1);
              }
              if (!bVar7) {
LAB_0014bad0:
                bVar7 = false;
                goto LAB_0014bad2;
              }
            }
            bVar7 = true;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_200,"Cannot find any files in the installed directory",0x30)
            ;
            std::ios::widen((char)*(ulong *)(local_200._0_8_ + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
            pcVar2 = this->Logger;
            std::__cxx11::stringbuf::str();
            uVar19 = local_358._0_8_;
            sVar10 = strlen((char *)local_358._0_8_);
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x164,(char *)uVar19,sVar10);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_358 + 0x10)) {
              operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
            std::ios_base::~ios_base(local_190);
            bVar7 = false;
          }
LAB_0014bad2:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          cmsys::Glob::~Glob((Glob *)local_258);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_2a8);
          if (!bVar7) goto LAB_0014bd9a;
          pbVar15 = local_288 + 2;
        } while (pbVar15 !=
                 local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      iVar16 = 1;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_200,
                 "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and <subdirectory>. The <subdirectory> can be \'.\' to be installed in the toplevel directory of installation."
                 ,0xac);
      std::ios::widen((char)*(ulong *)(local_200._0_8_ + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      uVar19 = local_258._0_8_;
      sVar10 = strlen((char *)local_258._0_8_);
      cmCPackLog::Log(pcVar2,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x14e,(char *)uVar19,sVar10);
      if ((GlobInternals *)local_258._0_8_ != (GlobInternals *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,(ulong)(local_258._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      std::ios_base::~ios_base(local_190);
LAB_0014bd9a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      iVar16 = 0;
    }
  }
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
            (&local_68);
  return iVar16;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstalledDirectories(
  bool setDestDir, const std::string& tempInstallDirectory,
  const mode_t* default_dir_mode)
{
  (void)setDestDir;
  (void)tempInstallDirectory;
  std::vector<cmsys::RegularExpression> ignoreFilesRegex;
  const char* cpackIgnoreFiles = this->GetOption("CPACK_IGNORE_FILES");
  if (cpackIgnoreFiles) {
    std::vector<std::string> ignoreFilesRegexString;
    cmSystemTools::ExpandListArgument(cpackIgnoreFiles,
                                      ignoreFilesRegexString);
    for (std::string const& ifr : ignoreFilesRegexString) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Create ignore files regex for: " << ifr << std::endl);
      ignoreFilesRegex.emplace_back(ifr);
    }
  }
  const char* installDirectories =
    this->GetOption("CPACK_INSTALLED_DIRECTORIES");
  if (installDirectories && *installDirectories) {
    std::vector<std::string> installDirectoriesVector;
    cmSystemTools::ExpandListArgument(installDirectories,
                                      installDirectoriesVector);
    if (installDirectoriesVector.size() % 2 != 0) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "CPACK_INSTALLED_DIRECTORIES should contain pairs of <directory> and "
        "<subdirectory>. The <subdirectory> can be '.' to be installed in "
        "the toplevel directory of installation."
          << std::endl);
      return 0;
    }
    std::vector<std::string>::iterator it;
    const std::string& tempDir = tempInstallDirectory;
    for (it = installDirectoriesVector.begin();
         it != installDirectoriesVector.end(); ++it) {
      std::vector<std::pair<std::string, std::string>> symlinkedFiles;
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
      cmsys::Glob gl;
      std::string top = *it;
      it++;
      std::string subdir = *it;
      std::string findExpr = top;
      findExpr += "/*";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- Install directory: " << top << std::endl);
      gl.RecurseOn();
      gl.SetRecurseListDirs(true);
      if (!gl.FindFiles(findExpr)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot find any files in the installed directory"
                        << std::endl);
        return 0;
      }
      files = gl.GetFiles();
      for (std::string const& gf : files) {
        bool skip = false;
        std::string inFile = gf;
        if (cmSystemTools::FileIsDirectory(gf)) {
          inFile += '/';
        }
        for (cmsys::RegularExpression& reg : ignoreFilesRegex) {
          if (reg.find(inFile)) {
            cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                          "Ignore file: " << inFile << std::endl);
            skip = true;
          }
        }
        if (skip) {
          continue;
        }
        std::string filePath = tempDir;
        filePath += "/" + subdir + "/" + cmSystemTools::RelativePath(top, gf);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Copy file: " << inFile << " -> " << filePath
                                    << std::endl);
        /* If the file is a symlink we will have to re-create it */
        if (cmSystemTools::FileIsSymlink(inFile)) {
          std::string targetFile;
          std::string inFileRelative =
            cmSystemTools::RelativePath(top, inFile);
          cmSystemTools::ReadSymlink(inFile, targetFile);
          symlinkedFiles.emplace_back(std::move(targetFile),
                                      std::move(inFileRelative));
        }
        /* If it is not a symlink then do a plain copy */
        else if (!(cmSystemTools::CopyFileIfDifferent(inFile, filePath) &&
                   cmFileTimes::Copy(inFile, filePath))) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Problem copying file: " << inFile << " -> "
                                                 << filePath << std::endl);
          return 0;
        }
      }
      /* rebuild symlinks in the installed tree */
      if (!symlinkedFiles.empty()) {
        std::string curDir = cmSystemTools::GetCurrentWorkingDirectory();
        std::string goToDir = tempDir;
        goToDir += "/" + subdir;
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Change dir to: " << goToDir << std::endl);
        cmWorkingDirectory workdir(goToDir);
        if (workdir.Failed()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Failed to change working directory to "
                          << goToDir << " : "
                          << std::strerror(workdir.GetLastResult())
                          << std::endl);
          return 0;
        }
        for (auto const& symlinked : symlinkedFiles) {
          cmCPackLogger(cmCPackLog::LOG_DEBUG,
                        "Will create a symlink: " << symlinked.second << "--> "
                                                  << symlinked.first
                                                  << std::endl);
          // make sure directory exists for symlink
          std::string destDir =
            cmSystemTools::GetFilenamePath(symlinked.second);
          if (!destDir.empty() &&
              !cmSystemTools::MakeDirectory(destDir, default_dir_mode)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create dir: "
                            << destDir << "\nTrying to create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
          }
          if (!cmSystemTools::CreateSymlink(symlinked.first,
                                            symlinked.second)) {
            cmCPackLogger(cmCPackLog::LOG_ERROR,
                          "Cannot create symlink: "
                            << symlinked.second << "--> " << symlinked.first
                            << std::endl);
            return 0;
          }
        }
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
                      "Going back to: " << curDir << std::endl);
      }
    }
  }
  return 1;
}